

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int PatchCodePtrs(int dummy)

{
  PStruct *pPVar1;
  int iVar2;
  uint statenum;
  uint uVar3;
  uint uVar4;
  CodePointerAlias *pCVar5;
  char *pcVar6;
  CodePointerAlias *this;
  DObject *p;
  Variant *pVVar7;
  uint *puVar8;
  TArray<unsigned_int,_unsigned_int> *args;
  PFunction *local_40;
  PFunction *sym;
  uint i;
  FString local_28;
  FString symname;
  FState *state;
  int frame;
  int result;
  int dummy_local;
  
  DPrintf(4,"[CodePtr]\n");
  while (iVar2 = GetLine(), iVar2 == 1) {
    iVar2 = strncasecmp("Frame",Line1,5);
    if ((iVar2 == 0) && (iVar2 = isspace((int)Line1[5]), iVar2 != 0)) {
      statenum = atoi(Line1 + 5);
      symname.Chars = (char *)FindState(statenum);
      stripwhite(Line2);
      if (symname.Chars == (char *)0x0) {
        Printf("Frame %d out of range\n",(ulong)statenum);
      }
      else {
        iVar2 = strcasecmp(Line2,"NULL");
        if (iVar2 == 0) {
          SetPointer((FState *)symname.Chars,(PFunction *)0x0,0);
        }
        else {
          FString::FString(&local_28);
          if (((*Line2 == 'A') || (*Line2 == 'a')) && (Line2[1] == '_')) {
            FString::operator=(&local_28,Line2);
          }
          else {
            FString::Format(&local_28,"A_%s",Line2);
          }
          for (sym._0_4_ = 0; uVar4 = (uint)sym,
              uVar3 = TArray<CodePointerAlias,_CodePointerAlias>::Size(&MBFCodePointers),
              uVar4 < uVar3; sym._0_4_ = (uint)sym + 1) {
            pCVar5 = TArray<CodePointerAlias,_CodePointerAlias>::operator[]
                               (&MBFCodePointers,(ulong)(uint)sym);
            iVar2 = FString::CompareNoCase(&local_28,pCVar5->alias);
            if (iVar2 == 0) {
              pCVar5 = TArray<CodePointerAlias,_CodePointerAlias>::operator[]
                                 (&MBFCodePointers,(ulong)(uint)sym);
              pcVar6 = FName::operator_cast_to_char_(&pCVar5->name);
              FString::operator=(&local_28,pcVar6);
              pCVar5 = TArray<CodePointerAlias,_CodePointerAlias>::operator[]
                                 (&MBFCodePointers,(ulong)(uint)sym);
              this = TArray<CodePointerAlias,_CodePointerAlias>::operator[]
                               (&MBFCodePointers,(ulong)(uint)sym);
              pcVar6 = FName::GetChars(&this->name);
              Printf("%s --> %s\n",pCVar5->alias,pcVar6);
            }
          }
          pPVar1 = &(AInventory::RegistrationInfo.MyClass)->super_PStruct;
          FName::FName((FName *)((long)&args + 4),&local_28);
          p = &PSymbolTable::FindSymbol
                         (&(pPVar1->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                          (FName *)((long)&args + 4),true)->super_DObject;
          local_40 = dyn_cast<PFunction>(p);
          if (local_40 == (PFunction *)0x0) {
            Printf("Frame %d: Unknown code pointer \'%s\'\n",(ulong)statenum,Line2);
          }
          else {
            pVVar7 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                               (&local_40->Variants,0);
            if (((local_40->Flags & 6) != 6) ||
               ((uVar4 = TArray<unsigned_int,_unsigned_int>::Size(&pVVar7->ArgFlags), 3 < uVar4 &&
                (puVar8 = TArray<unsigned_int,_unsigned_int>::operator[](&pVVar7->ArgFlags,3),
                (*puVar8 & 1) == 0)))) {
              Printf("Frame %d: Incompatible code pointer \'%s\'\n",(ulong)statenum,Line2);
              local_40 = (PFunction *)0x0;
            }
          }
          SetPointer((FState *)symname.Chars,local_40,statenum);
          FString::~FString(&local_28);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int PatchCodePtrs (int dummy)
{
	int result;

	DPrintf (DMSG_SPAMMY, "[CodePtr]\n");

	while ((result = GetLine()) == 1)
	{
		if (!strnicmp ("Frame", Line1, 5) && isspace(Line1[5]))
		{
			int frame = atoi (Line1 + 5);
			FState *state = FindState (frame);

			stripwhite (Line2);
			if (state == NULL)
			{
				Printf ("Frame %d out of range\n", frame);
			}
			else if (!stricmp(Line2, "NULL"))
			{
				SetPointer(state, NULL);
			}
			else
			{
				FString symname;


				if ((Line2[0] == 'A' || Line2[0] == 'a') && Line2[1] == '_')
					symname = Line2;
				else
					symname.Format("A_%s", Line2);

				// Let's consider as aliases some redundant MBF pointer
				for (unsigned int i = 0; i < MBFCodePointers.Size(); i++)
				{
					if (!symname.CompareNoCase(MBFCodePointers[i].alias))
					{
						symname = MBFCodePointers[i].name;
						Printf("%s --> %s\n", MBFCodePointers[i].alias, MBFCodePointers[i].name.GetChars());
					}
				}

				// This skips the action table and goes directly to the internal symbol table
				// DEH compatible functions are easy to recognize.
				PFunction *sym = dyn_cast<PFunction>(RUNTIME_CLASS(AInventory)->Symbols.FindSymbol(symname, true));
				if (sym == NULL)
				{
					Printf("Frame %d: Unknown code pointer '%s'\n", frame, Line2);
				}
				else
				{
					TArray<DWORD> &args = sym->Variants[0].ArgFlags;
					if ((sym->Flags & (VARF_Method | VARF_Action)) != (VARF_Method | VARF_Action) || (args.Size() > NAP && !(args[NAP] & VARF_Optional)))
					{
						Printf("Frame %d: Incompatible code pointer '%s'\n", frame, Line2);
						sym = NULL;
					}
				}
				SetPointer(state, sym, frame);
			}
		}
	}
	return result;
}